

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall
HFactor::ftranU(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  HighsTimer *this_00;
  HighsInt HVar15;
  uint uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[0xb]);
  }
  if (this->update_method == 3) {
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      ftranMPF(this,rhs);
LAB_00373d86:
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      goto LAB_00373d96;
    }
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[0xd]);
    ftranMPF(this,rhs);
    HVectorBase<double>::tight(rhs);
    HVectorBase<double>::pack(rhs);
    this_00 = factor_timer_clock_pointer->timer_pointer_;
    iVar14 = (factor_timer_clock_pointer->clock_).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start[0xd];
  }
  else {
    if (this->update_method != 1) goto LAB_00373d96;
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      ftranFT(this,rhs);
      goto LAB_00373d86;
    }
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[0xc]);
    ftranFT(this,rhs);
    HVectorBase<double>::tight(rhs);
    HVectorBase<double>::pack(rhs);
    this_00 = factor_timer_clock_pointer->timer_pointer_;
    iVar14 = (factor_timer_clock_pointer->clock_).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start[0xc];
  }
  HighsTimer::stop(this_00,iVar14);
LAB_00373d96:
  dVar18 = (double)rhs->count * this->inv_num_row;
  if (((0.1 < expected_density) || (rhs->count < 0)) || (0.05 < dVar18)) {
    uVar16 = 0x11;
    if (0.1 <= dVar18) {
      uVar16 = (dVar18 < 0.5) + 0xf;
    }
    uVar17 = (ulong)uVar16;
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar17]);
    }
    piVar2 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (uint)((ulong)((long)(this->u_pivot_index).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
    if ((int)uVar16 < 1) {
      dVar18 = 0.0;
      HVar15 = 0;
    }
    else {
      piVar3 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      HVar15 = 0;
      dVar18 = 0.0;
      uVar11 = (ulong)(uVar16 & 0x7fffffff);
      do {
        uVar12 = uVar11 - 1;
        iVar14 = piVar2[uVar11 - 1];
        lVar13 = (long)iVar14;
        if (lVar13 != -1) {
          if (ABS(pdVar4[lVar13]) <= 1e-14) {
            pdVar4[lVar13] = 0.0;
          }
          else {
            dVar19 = pdVar4[lVar13] / pdVar9[uVar12];
            piVar3[HVar15] = iVar14;
            pdVar4[lVar13] = dVar19;
            iVar14 = piVar5[uVar12];
            lVar13 = (long)iVar14;
            iVar1 = piVar6[uVar12];
            if ((long)this->num_row < (long)uVar11) {
              dVar18 = dVar18 + (double)(iVar1 - iVar14);
            }
            HVar15 = HVar15 + 1;
            if (iVar14 < iVar1) {
              do {
                iVar14 = piVar7[lVar13];
                pdVar4[iVar14] = pdVar8[lVar13] * -dVar19 + pdVar4[iVar14];
                lVar13 = lVar13 + 1;
              } while (iVar1 != lVar13);
            }
          }
        }
        bVar10 = 1 < (long)uVar11;
        uVar11 = uVar12;
      } while (bVar10);
    }
    rhs->count = HVar15;
    rhs->synthetic_tick =
         dVar18 * 15.0 + (double)(int)((uVar16 - this->num_row) * 10) + rhs->synthetic_tick;
  }
  else {
    uVar17 = 0x17;
    if (((5e-06 <= dVar18) && (uVar17 = 0x16, 1e-05 <= dVar18)) &&
       ((uVar17 = 0x15, 0.0001 <= dVar18 && (uVar17 = 0x14, 0.001 <= dVar18)))) {
      uVar17 = (ulong)(dVar18 < 0.01) | 0x12;
    }
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar17]);
    }
    solveHyper(this->num_row,
               (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
  }
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar17]);
  }
  if (this->update_method == 2) {
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      ftranPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
    }
    else {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x18]);
      ftranPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                       (factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[0x18]);
    }
  }
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[0xb]);
    return;
  }
  return;
}

Assistant:

void HFactor::ftranU(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  assert(rhs.count >= 0);
  FactorTimer factor_timer;
  factor_timer.start(FactorFtranUpper, factor_timer_clock_pointer);
  // The update part
  if (update_method == kUpdateMethodFt) {
    factor_timer.start(FactorFtranUpperFT, factor_timer_clock_pointer);
    ftranFT(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperFT, factor_timer_clock_pointer);
  } else if (update_method == kUpdateMethodMpf) {
    assert(!(update_method == kUpdateMethodMpf));
    factor_timer.start(FactorFtranUpperMPF, factor_timer_clock_pointer);
    ftranMPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperMPF, factor_timer_clock_pointer);
  }

  // The regular part
  //
  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperFtranU;
  if (sparse_solve) {
    const bool report_ftran_upper_sparse =
        false;  // current_density < kHyperCancel;
    HighsInt use_clock;
    if (current_density < 0.1)
      use_clock = FactorFtranUpperSps2;
    else if (current_density < 0.5)
      use_clock = FactorFtranUpperSps1;
    else
      use_clock = FactorFtranUpperSps0;
    factor_timer.start(use_clock, factor_timer_clock_pointer);
    // Alias to non constant
    double rhs_synthetic_tick = 0;
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor U
    const HighsInt* u_start = this->u_start.data();
    const HighsInt* u_end = this->u_last_p.data();
    const HighsInt* u_index = this->u_index.data();
    const double* u_value = this->u_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    HighsInt u_pivot_count = u_pivot_index.size();
    for (HighsInt i_logic = u_pivot_count - 1; i_logic >= 0; i_logic--) {
      // Skip void
      if (u_pivot_index[i_logic] == -1) continue;
      // Normal part
      const HighsInt pivotRow = u_pivot_index[i_logic];
      double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        pivot_multiplier /= u_pivot_value[i_logic];
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = u_start[i_logic];
        const HighsInt end = u_end[i_logic];
        if (i_logic >= num_row) {
          rhs_synthetic_tick += (end - start);
        }
        for (HighsInt k = start; k < end; k++)
          rhs_array[u_index[k]] -= pivot_multiplier * u_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    rhs.synthetic_tick +=
        rhs_synthetic_tick * 15 + (u_pivot_count - num_row) * 10;
    factor_timer.stop(use_clock, factor_timer_clock_pointer);
    if (report_ftran_upper_sparse) {
      const double final_density = 1.0 * rhs.count * inv_num_row;
      printf(
          "FactorFtranUpperSps: expected_density = %10.4g; current_density = "
          "%10.4g; final_density = %10.4g\n",
          expected_density, current_density, final_density);
    }
  } else {
    HighsInt use_clock = -1;
    if (current_density < 5e-6)
      use_clock = FactorFtranUpperHyper5;
    else if (current_density < 1e-5)
      use_clock = FactorFtranUpperHyper4;
    else if (current_density < 1e-4)
      use_clock = FactorFtranUpperHyper3;
    else if (current_density < 1e-3)
      use_clock = FactorFtranUpperHyper2;
    else if (current_density < 1e-2)
      use_clock = FactorFtranUpperHyper1;
    else
      use_clock = FactorFtranUpperHyper0;
    factor_timer.start(use_clock, factor_timer_clock_pointer);
    const HighsInt* u_index = this->u_index.data();
    const double* u_value = this->u_value.data();
    solveHyper(num_row, u_pivot_lookup.data(), u_pivot_index.data(),
               u_pivot_value.data(), u_start.data(), u_last_p.data(),
               &u_index[0], &u_value[0], &rhs);
    factor_timer.stop(use_clock, factor_timer_clock_pointer);
  }
  if (update_method == kUpdateMethodPf) {
    assert(!(update_method == kUpdateMethodPf));
    factor_timer.start(FactorFtranUpperPF, factor_timer_clock_pointer);
    ftranPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorFtranUpperPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorFtranUpper, factor_timer_clock_pointer);
}